

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readme_examples.c
# Opt level: O3

void supports_full_hd_should_check_for_full_hd_support(void)

{
  int iVar1;
  
  iVar1 = supports_full_hd(
                          "{\n\t\"name\":\t\"Awesome 4K\",\n\t\"resolutions\":\t[{\n\t\t\t\"width\":\t1280,\n\t\t\t\"height\":\t720\n\t\t}, {\n\t\t\t\"width\":\t1920,\n\t\t\t\"height\":\t1080\n\t\t}, {\n\t\t\t\"width\":\t3840,\n\t\t\t\"height\":\t2160\n\t\t}]\n}"
                          );
  if (iVar1 == 0) {
    UnityFail(" Expression Evaluated To FALSE",0xf5);
  }
  iVar1 = supports_full_hd(
                          "{\n\t\t\"name\": \"lame monitor\",\n\t\t\"resolutions\":\t[{\n\t\t\t\"width\":\t640,\n\t\t\t\"height\":\t480\n\t\t}]\n}"
                          );
  if (iVar1 != 0) {
    UnityFail(" Expected FALSE Was TRUE",0xf6);
    return;
  }
  return;
}

Assistant:

static void supports_full_hd_should_check_for_full_hd_support(void)
{
    static const char *monitor_without_hd = "{\n\
\t\t\"name\": \"lame monitor\",\n\
\t\t\"resolutions\":\t[{\n\
\t\t\t\"width\":\t640,\n\
\t\t\t\"height\":\t480\n\
\t\t}]\n\
}";

    TEST_ASSERT(supports_full_hd(json));
    TEST_ASSERT_FALSE(supports_full_hd(monitor_without_hd));
}